

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGui::SetFocusID(ImGuiID id,ImGuiWindow *window)

{
  ImGuiNavLayer IVar1;
  ImRect IVar2;
  ImGuiContext *pIVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  
  pIVar3 = GImGui;
  IVar1 = (window->DC).NavLayerCurrent;
  if (GImGui->NavWindow != window) {
    GImGui->NavInitRequest = false;
  }
  pIVar3->NavWindow = window;
  pIVar3->NavId = id;
  pIVar3->NavLayer = IVar1;
  pIVar3->NavFocusScopeId = (window->DC).NavFocusScopeIdCurrent;
  window->NavLastIds[IVar1] = id;
  if ((window->DC).LastItemId == id) {
    auVar4._8_8_ = 0;
    auVar4._0_4_ = (window->Pos).x;
    auVar4._4_4_ = (window->Pos).y;
    auVar5._8_8_ = 0;
    auVar5._0_4_ = (window->DC).LastItemRect.Min.x;
    auVar5._4_4_ = (window->DC).LastItemRect.Min.y;
    auVar6._8_8_ = 0;
    auVar6._0_4_ = (window->DC).LastItemRect.Max.x;
    auVar6._4_4_ = (window->DC).LastItemRect.Max.y;
    auVar5 = vsubps_avx(auVar5,auVar4);
    auVar4 = vsubps_avx(auVar6,auVar4);
    IVar2 = (ImRect)vmovlhps_avx(auVar5,auVar4);
    window->NavRectRel[IVar1] = IVar2;
  }
  if (pIVar3->ActiveIdSource == ImGuiInputSource_Nav) {
    pIVar3->NavDisableMouseHover = true;
    return;
  }
  pIVar3->NavDisableHighlight = true;
  return;
}

Assistant:

void ImGui::SetFocusID(ImGuiID id, ImGuiWindow* window)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(id != 0);

    // Assume that SetFocusID() is called in the context where its window->DC.NavLayerCurrent and window->DC.NavFocusScopeIdCurrent are valid.
    // Note that window may be != g.CurrentWindow (e.g. SetFocusID call in InputTextEx for multi-line text)
    const ImGuiNavLayer nav_layer = window->DC.NavLayerCurrent;
    if (g.NavWindow != window)
        g.NavInitRequest = false;
    g.NavWindow = window;
    g.NavId = id;
    g.NavLayer = nav_layer;
    g.NavFocusScopeId = window->DC.NavFocusScopeIdCurrent;
    window->NavLastIds[nav_layer] = id;
    if (window->DC.LastItemId == id)
        window->NavRectRel[nav_layer] = ImRect(window->DC.LastItemRect.Min - window->Pos, window->DC.LastItemRect.Max - window->Pos);

    if (g.ActiveIdSource == ImGuiInputSource_Nav)
        g.NavDisableMouseHover = true;
    else
        g.NavDisableHighlight = true;
}